

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

Constant * __thiscall
soul::PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation,soul::Value>
          (PoolAllocator *this,CodeLocation *args,Value *args_1)

{
  PoolItem *pPVar1;
  ulong uVar2;
  CodeLocation local_78;
  Value local_60;
  
  pPVar1 = allocateSpaceForObject(this,0x58);
  local_78.sourceCode.object = (args->sourceCode).object;
  local_78.location.data = (args->location).data;
  (args->sourceCode).object = (SourceCodeText *)0x0;
  local_60.type.category = (args_1->type).category;
  local_60.type.arrayElementCategory = (args_1->type).arrayElementCategory;
  local_60.type.isRef = (args_1->type).isRef;
  local_60.type.isConstant = (args_1->type).isConstant;
  local_60.type.primitiveType.type = (args_1->type).primitiveType.type;
  local_60.type.boundingSize = (args_1->type).boundingSize;
  local_60.type.arrayElementBoundingSize = (args_1->type).arrayElementBoundingSize;
  local_60.type.structure.object = (args_1->type).structure.object;
  (args_1->type).structure.object = (Structure *)0x0;
  local_60.allocatedData.allocatedSize = (args_1->allocatedData).allocatedSize;
  local_60.allocatedData.allocatedData.numAllocated = 8;
  uVar2 = (args_1->allocatedData).allocatedData.numAllocated;
  if (uVar2 < 9) {
    local_60.allocatedData.allocatedData.items = (uchar *)local_60.allocatedData.allocatedData.space
    ;
    local_60.allocatedData.allocatedData.numActive = (args_1->allocatedData).allocatedData.numActive
    ;
    if (local_60.allocatedData.allocatedData.numActive != 0) {
      uVar2 = 0;
      do {
        *(uchar *)((long)local_60.allocatedData.allocatedData.items + uVar2) =
             (args_1->allocatedData).allocatedData.items[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_60.allocatedData.allocatedData.numActive);
    }
  }
  else {
    local_60.allocatedData.allocatedData.items = (args_1->allocatedData).allocatedData.items;
    local_60.allocatedData.allocatedData.numActive = (args_1->allocatedData).allocatedData.numActive
    ;
    (args_1->allocatedData).allocatedData.items =
         (uchar *)(args_1->allocatedData).allocatedData.space;
    (args_1->allocatedData).allocatedData.numAllocated = 8;
    (args_1->allocatedData).allocatedData.numActive = 0;
    local_60.allocatedData.allocatedData.numAllocated = uVar2;
  }
  heart::Constant::Constant((Constant *)&pPVar1->item,&local_78,&local_60);
  soul::Value::~Value(&local_60);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.sourceCode.object);
  pPVar1->destructor =
       allocate<soul::heart::Constant,_soul::CodeLocation,_soul::Value>::anon_class_1_0_00000001::
       __invoke;
  return (Constant *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }